

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XMLDateTime::normalize(XMLDateTime *this)

{
  uint uVar1;
  div_t dVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  bool bVar9;
  
  if ((uint)this->fValue[7] < 2) {
    return;
  }
  iVar7 = (uint)(this->fValue[7] != 2) * 2 + -1;
  iVar3 = this->fValue[1];
  dVar2 = div(iVar3 + -1,0xc);
  iVar5 = dVar2.quot;
  uVar4 = iVar3 + iVar5 * -0xc;
  this->fValue[1] = uVar4;
  if ((int)uVar4 < 1) {
    uVar4 = uVar4 + 0xc;
    this->fValue[1] = uVar4;
    iVar5 = iVar5 + -1;
  }
  uVar6 = iVar5 + this->fValue[0];
  this->fValue[0] = uVar6;
  iVar3 = this->fTimeZone[1] * iVar7 + this->fValue[4];
  dVar2 = div(iVar3,0x3c);
  iVar5 = dVar2.quot;
  iVar3 = iVar5 * -0x3c + iVar3;
  this->fValue[4] = iVar3;
  if (iVar3 < 0) {
    this->fValue[4] = iVar3 + 0x3c;
    iVar5 = iVar5 + -1;
  }
  iVar3 = iVar5 + this->fValue[3] + iVar7 * this->fTimeZone[0];
  dVar2 = div(iVar3,0x18);
  iVar5 = dVar2.quot;
  iVar3 = iVar3 + iVar5 * -0x18;
  this->fValue[3] = iVar3;
  if (iVar3 < 0) {
    this->fValue[3] = iVar3 + 0x18;
    iVar5 = iVar5 + -1;
  }
  uVar8 = iVar5 + this->fValue[2];
  this->fValue[2] = uVar8;
  do {
    if (uVar4 < 0xc) {
      uVar1 = 0x1e;
      if ((0xa50U >> (uVar4 & 0x1f) & 1) == 0) {
        if (uVar4 != 2) goto LAB_0024b537;
        uVar1 = 0x1c;
        if ((uVar6 & 3) == 0) {
          uVar1 = uVar6 * -0x3d70a3d7 + 0x51eb850;
          uVar1 = ((uVar1 >> 4 | uVar6 * -0x70000000) < 0xa3d70b ||
                  0x28f5c28 < (uVar1 >> 2 | uVar6 * 0x40000000)) | 0x1c;
        }
      }
    }
    else {
LAB_0024b537:
      uVar1 = 0x1f;
    }
    if ((int)uVar8 < 1) {
      if (uVar4 < 0xd) {
        uVar1 = 0x1e;
        if ((0x14a0U >> (uVar4 & 0x1f) & 1) == 0) {
          if (uVar4 != 3) goto LAB_0024b588;
          uVar1 = 0x1c;
          if ((uVar6 & 3) == 0) {
            uVar1 = uVar6 * -0x3d70a3d7 + 0x51eb850;
            uVar1 = ((uVar1 >> 4 | uVar6 * -0x70000000) < 0xa3d70b ||
                    0x28f5c28 < (uVar1 >> 2 | uVar6 * 0x40000000)) | 0x1c;
          }
        }
      }
      else {
LAB_0024b588:
        uVar1 = 0x1f;
      }
      uVar8 = uVar8 + uVar1;
      iVar3 = -1;
    }
    else {
      bVar9 = uVar8 < uVar1;
      uVar8 = uVar8 - uVar1;
      if (bVar9 || uVar8 == 0) {
        this->fValue[7] = 1;
        return;
      }
      iVar3 = 1;
    }
    this->fValue[2] = uVar8;
    dVar2 = div(iVar3 + uVar4 + -1,0xc);
    uVar4 = iVar3 + uVar4 + dVar2.quot * -0xc;
    this->fValue[1] = uVar4;
    if ((int)uVar4 < 1) {
      uVar4 = uVar4 + 0xc;
      this->fValue[1] = uVar4;
      uVar6 = uVar6 - 1;
    }
    uVar6 = uVar6 + dVar2.quot;
    this->fValue[0] = uVar6;
  } while( true );
}

Assistant:

void XMLDateTime::normalize()
{

    if ((fValue[utc] == UTC_UNKNOWN) ||
        (fValue[utc] == UTC_STD)      )
        return;

    int negate = (fValue[utc] == UTC_POS)? -1: 1;
    int temp;
    int carry;


    // we normalize a duration so could have 200M...
    //update months (may be modified additionaly below)
    temp = fValue[Month];
    fValue[Month] = modulo(temp, 1, 13);
    carry = fQuotient(temp, 1, 13);
    if (fValue[Month] <= 0) {
        fValue[Month]+= 12;
        carry--;
    }

    //add years (may be modified additionaly below)
    fValue[CentYear] += carry;

    // add mins
    temp = fValue[Minute] + negate * fTimeZone[mm];
    carry = fQuotient(temp, 60);
    fValue[Minute] = mod(temp, 60, carry);
    if (fValue[Minute] < 0) {
        fValue[Minute] += 60;
        carry--;
    }

    //add hours
    temp = fValue[Hour] + negate * fTimeZone[hh] + carry;
    carry = fQuotient(temp, 24);
    fValue[Hour] = mod(temp, 24, carry);
    if (fValue[Hour] < 0) {
        fValue[Hour] += 24;
        carry--;
    }

    fValue[Day] += carry;

    while (1)
    {
        temp = maxDayInMonthFor(fValue[CentYear], fValue[Month]);
        if (fValue[Day] < 1)
        {
            fValue[Day] += maxDayInMonthFor(fValue[CentYear], fValue[Month] - 1);
            carry = -1;
        }
        else if ( fValue[Day] > temp )
        {
            fValue[Day] -= temp;
            carry = 1;
        }
        else
        {
            break;
        }

        temp = fValue[Month] + carry;
        fValue[Month] = modulo(temp, 1, 13);
        if (fValue[Month] <=0) {
            fValue[Month]+= 12;
            fValue[CentYear]--;
        }
        fValue[CentYear] += fQuotient(temp, 1, 13);
    }

    // set to normalized
    fValue[utc] = UTC_STD;

    return;
}